

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O0

void __thiscall
tchecker::while_statement_t::while_statement_t
          (while_statement_t *this,shared_ptr<const_tchecker::expression_t> *cond,
          shared_ptr<const_tchecker::statement_t> *stmt)

{
  element_type *peVar1;
  invalid_argument *piVar2;
  element_type *peVar3;
  shared_ptr<const_tchecker::statement_t> *stmt_local;
  shared_ptr<const_tchecker::expression_t> *cond_local;
  while_statement_t *this_local;
  
  statement_t::statement_t((statement_t *)this);
  *(undefined ***)this = &PTR__while_statement_t_00348010;
  *(undefined ***)this = &PTR__while_statement_t_00348010;
  std::shared_ptr<const_tchecker::expression_t>::shared_ptr(&this->_condition,cond);
  std::shared_ptr<const_tchecker::statement_t>::shared_ptr(&this->_stmt,stmt);
  peVar1 = std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&cond->
                       super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar1 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr condition");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&stmt->
                       super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar3 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr iterated statement");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

while_statement_t::while_statement_t(std::shared_ptr<tchecker::expression_t const> const & cond,
                                     std::shared_ptr<tchecker::statement_t const> const & stmt)
    : _condition(cond), _stmt(stmt)
{
  if (cond.get() == nullptr)
    throw std::invalid_argument("nullptr condition");
  if (stmt.get() == nullptr)
    throw std::invalid_argument("nullptr iterated statement");
}